

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

int __thiscall Array<String>::remove(Array<String> *this,char *__filename)

{
  String *this_00;
  String *pSVar1;
  
  this_00 = *(String **)__filename;
  pSVar1 = (this->_end).item + -1;
  (this->_end).item = pSVar1;
  while (this_00 < pSVar1) {
    String::operator=(this_00,this_00 + 1);
    this_00 = this_00 + 1;
  }
  String::~String(this_00);
  return (int)*(undefined8 *)__filename;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    T* pos = it.item;
    for(T* end = --_end.item, * dest; pos < end;)
    {
      dest = pos;
      *dest = *(++pos);
    }
    pos->~T();
    return it.item;
  }